

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

size_t __thiscall
sentencepiece::ModelProto_SentencePiece::ByteSizeLong(ModelProto_SentencePiece *this)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  sVar4 = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  uVar6 = (this->_has_bits_).has_bits_[0];
  if ((uVar6 & 7) != 0) {
    sVar5 = sVar4;
    if ((uVar6 & 1) != 0) {
      lVar1 = *(long *)(((ulong)(this->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar8 = (uint)lVar1 | 1;
      iVar3 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar4 + lVar1 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    sVar4 = sVar5 + 5;
    if ((uVar6 & 2) == 0) {
      sVar4 = sVar5;
    }
    if ((uVar6 & 4) != 0) {
      if (this->type_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar6 = this->type_ | 1;
        iVar3 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar7 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar4 = sVar4 + uVar7;
    }
  }
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    sVar4 = sVar4 + *(long *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict1)sVar4;
  return sVar4;
}

Assistant:

size_t ModelProto_SentencePiece::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.ModelProto.SentencePiece)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    // optional string piece = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_piece());
    }

    // optional float score = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 + 4;
    }

    // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_type());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}